

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

type __thiscall
fmt::v7::
format_to<fmt::v7::detail::buffer_appender<char>,char[10],std::basic_string_view<char,std::char_traits<char>>const&,int_const&,true>
          (v7 *this,buffer_appender<char> out,char (*format_str) [10],
          basic_string_view<char,_std::char_traits<char>_> *args,int *args_1)

{
  type tVar1;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_00;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_a0;
  basic_string_view<char> local_90;
  v7 *local_80;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::basic_string_view<char,_std::char_traits<char>_>,_const_int>
  local_78;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::basic_string_view<char,_std::char_traits<char>_>,_const_int>
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::basic_string_view<char,_std::char_traits<char>_>,_const_int>
  *vargs;
  int *args_local_1;
  basic_string_view<char,_std::char_traits<char>_> *args_local;
  char (*format_str_local) [10];
  buffer_appender<char> out_local;
  
  vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::basic_string_view<char,_std::char_traits<char>_>,_const_int>
           *)args;
  args_local_1 = (int *)format_str;
  args_local = (basic_string_view<char,_std::char_traits<char>_> *)
               out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  format_str_local = (char (*) [10])this;
  make_args_checked<std::basic_string_view<char,std::char_traits<char>>const&,int_const&,char[10],char>
            (&local_78,
             (v7 *)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
             format_str,args,args_1);
  local_50 = &local_78;
  local_80 = (v7 *)format_str_local;
  local_90 = to_string_view<char,_0>((char *)args_local);
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args(&local_a0,0x1d,
                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)local_50);
  args_00.field_1.values_ =
       (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)args_1
  ;
  args_00.desc_ = (unsigned_long_long)local_a0.field_1.values_;
  tVar1 = vformat_to<fmt::v7::detail::buffer_appender<char>,fmt::v7::basic_string_view<char>,char,true>
                    (local_80,(buffer_appender<char>)&local_90,
                     (basic_string_view<char> *)local_a0.desc_,args_00);
  return (type)tVar1.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
}

Assistant:

inline auto format_to(OutputIt out, const S& format_str, Args&&... args) ->
    typename std::enable_if<enable, OutputIt>::type {
  const auto& vargs = fmt::make_args_checked<Args...>(format_str, args...);
  return vformat_to(out, to_string_view(format_str), vargs);
}